

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

PlayerStrategy * __thiscall PlayerStrategy::operator=(PlayerStrategy *this,PlayerStrategy *rhs)

{
  int *piVar1;
  Country *pCVar2;
  string *__return_storage_ptr__;
  string *psVar3;
  
  piVar1 = rhs->exchangingCardType;
  this->armiesToPlace = rhs->armiesToPlace;
  this->exchangingCardType = piVar1;
  pCVar2 = rhs->from;
  this->player = rhs->player;
  this->from = pCVar2;
  this->to = rhs->to;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  psVar3 = getStrategyName_abi_cxx11_(__return_storage_ptr__,rhs);
  operator_delete(__return_storage_ptr__,0x20);
  _Unwind_Resume(psVar3);
}

Assistant:

PlayerStrategy& PlayerStrategy::operator=(const PlayerStrategy& rhs) {
    this->exchangingCardType = rhs.exchangingCardType;
    this->armiesToPlace = rhs.armiesToPlace;
    this->player = rhs.player;
    this->from = rhs.from;
    this->to = rhs.to;
    this->strategyName = new std::string(rhs.getStrategyName());
}